

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O2

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::ProceduralDeassignStatement>
          (ASTSerializer *this,ProceduralDeassignStatement *elem,bool inMembersArray)

{
  string_view sVar1;
  
  JsonWriter::startObject(this->writer);
  sVar1 = ast::toString((elem->super_Statement).kind);
  write(this,4,"kind",sVar1._M_len);
  ProceduralDeassignStatement::serializeTo(elem,this);
  JsonWriter::endObject(this->writer);
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    // TODO: remove once we no longer support gcc-10
    (void)inMembersArray;

    if constexpr (std::is_base_of_v<Expression, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));
        write("type", *elem.type);

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        EvalContext ctx(compilation, EvalFlags::CacheResults);
        ConstantValue constant = elem.eval(ctx);
        if (constant)
            write("constant", constant);

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Type, T> && !std::is_same_v<TypeAliasType, T> &&
                       !std::is_same_v<ClassType, T> && !std::is_same_v<CovergroupType, T>) {
        writer.writeValue(elem.toString());
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            if (!inMembersArray) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::NotConst | MethodFlags::Randomize))
                return;
        }

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto scope = elem.getParentScope();
        if (scope) {
            auto attributes = scope->getCompilation().getAttributes(elem);
            if (!attributes.empty()) {
                startArray("attributes");
                for (auto attr : attributes)
                    serialize(*attr);
                endArray();
            }
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
}